

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powers.h
# Opt level: O0

Fp find_cachedpow10(int exp,int *k)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  Fp FVar4;
  int current;
  int idx;
  int approx;
  double one_log_ten;
  int *k_local;
  int exp_local;
  
  idx = ((int)((double)-(exp + 0x57) * 0.30102999566398114) + 0x15c) / 8;
  while( true ) {
    while (iVar3 = exp + powers_ten[idx].exp + 0x40, iVar3 < -0x3c) {
      idx = idx + 1;
    }
    if (iVar3 < -0x1f) break;
    idx = idx + -1;
  }
  *k = idx * 8 + -0x15c;
  uVar1 = powers_ten[idx].frac;
  uVar2 = powers_ten[idx].exp;
  FVar4.exp = uVar2;
  FVar4.frac = uVar1;
  FVar4._12_4_ = 0;
  return FVar4;
}

Assistant:

static Fp find_cachedpow10(int exp, int* k) {
  const double one_log_ten = 0.30102999566398114;

  int approx = static_cast<int>(-(exp + npowers) * one_log_ten);
  int idx = (approx - firstpower) / steppowers;

  while (1) {
    int current = exp + powers_ten[idx].exp + 64;

    if (current < expmin) {
      idx++;
      continue;
    }

    if (current > expmax) {
      idx--;
      continue;
    }

    *k = (firstpower + idx * steppowers);

    return powers_ten[idx];
  }
}